

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O3

void sdl_audio_callback(void *client,uint8_t *stream,int len)

{
  ulong uVar1;
  size_t sVar2;
  size_t dst_size;
  bool bVar3;
  
  sVar2 = audio_ring_buf.capacity;
  if (audio_ring_buf.read <= audio_ring_buf.write) {
    sVar2 = 0;
  }
  uVar1 = (audio_ring_buf.write - audio_ring_buf.read) + sVar2;
  latency_avg = latency_avg * 0.9 + ((float)(uVar1 >> 1) / 44100.0) * 1000.0 * 0.1;
  dst_size = (size_t)len;
  if (len <= (int)uVar1) {
    sVar2 = ring_buf_read(&audio_ring_buf,stream,dst_size);
    bVar3 = dst_size < sVar2;
    dst_size = dst_size - sVar2;
    if (bVar3 || dst_size == 0) {
      return;
    }
    stream = stream + sVar2;
  }
  memset(stream,0,dst_size);
  return;
}

Assistant:

void sdl_audio_callback(void* client, uint8_t* stream, int len)
{
    float latency = ((ring_buf_available(&audio_ring_buf) >> 1) / (float)SAMPLE_RATE) * 1000.0f;
    latency_avg = (latency_avg * 0.9f + latency * 0.1f);

    //printf("read latency: %.2f ms  avg: %.2f ms\n", latency, latency_avg);

    int available = (int)ring_buf_available(&audio_ring_buf);
    if (available >= len)
    {
        size_t read = ring_buf_read(&audio_ring_buf, stream, len);
        if (read < len)
            memset(stream + read, 0, len - read);
    }
    else
    {
        memset(stream, 0, len);
    }
}